

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanCommandBuffer.hpp
# Opt level: O0

void __thiscall
VulkanUtilities::VulkanCommandBuffer::BeginQuery
          (VulkanCommandBuffer *this,VkQueryPool queryPool,uint32_t query,VkQueryControlFlags flags,
          uint32_t queryFlag)

{
  undefined *puVar1;
  bool bVar2;
  undefined8 uVar3;
  Char *Message;
  undefined1 local_78 [8];
  string msg;
  undefined1 local_48 [8];
  string _msg;
  uint32_t queryFlag_local;
  VkQueryControlFlags flags_local;
  uint32_t query_local;
  VkQueryPool queryPool_local;
  VulkanCommandBuffer *this_local;
  
  _msg.field_2._12_4_ = queryFlag;
  if ((((this->m_State).InsidePassQueries | (this->m_State).OutsidePassQueries) & queryFlag) == 0) {
    if (this->m_VkCmdBuffer == (VkCommandBuffer)0x0) {
      Diligent::FormatString<char[26],char[32]>
                ((string *)local_78,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"m_VkCmdBuffer != VK_NULL_HANDLE",(char (*) [32])this);
      Message = (Char *)std::__cxx11::string::c_str();
      Diligent::DebugAssertionFailed
                (Message,"BeginQuery",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/VulkanUtilities/VulkanCommandBuffer.hpp"
                 ,0x260);
      std::__cxx11::string::~string((string *)local_78);
    }
    (*vkCmdBeginQuery)(this->m_VkCmdBuffer,queryPool,query,flags);
    bVar2 = IsInRenderScope(this);
    if (bVar2) {
      (this->m_State).InsidePassQueries = _msg.field_2._12_4_ | (this->m_State).InsidePassQueries;
    }
    else {
      (this->m_State).OutsidePassQueries = _msg.field_2._12_4_ | (this->m_State).OutsidePassQueries;
    }
  }
  else {
    Diligent::FormatString<char[148]>
              ((string *)local_48,
               (char (*) [148])
               "Another query of the same type is already active in the command buffer. Overlapping queries are not allowed in Vulkan. The command will be ignored."
              );
    puVar1 = Diligent::DebugMessageCallback;
    if (Diligent::DebugMessageCallback != (undefined *)0x0) {
      uVar3 = std::__cxx11::string::c_str();
      (*(code *)puVar1)(2,uVar3,0);
    }
    std::__cxx11::string::~string((string *)local_48);
  }
  return;
}

Assistant:

__forceinline void BeginQuery(VkQueryPool         queryPool,
                                  uint32_t            query,
                                  VkQueryControlFlags flags,
                                  uint32_t            queryFlag)
    {
        // queryPool must have been created with a queryType that differs from that of any queries that
        // are active within commandBuffer (17.2). In other words, only one query of given type can be active
        // in the command buffer.

        if ((m_State.InsidePassQueries | m_State.OutsidePassQueries) & queryFlag)
        {
            LOG_ERROR_MESSAGE("Another query of the same type is already active in the command buffer. "
                              "Overlapping queries are not allowed in Vulkan. The command will be ignored.");
            return;
        }

        // A query must either begin and end inside the same subpass of a render pass instance, or must both
        // begin and end outside a render pass instance (i.e. contain entire render pass instances)
        // (https://registry.khronos.org/vulkan/specs/latest/html/vkspec.html#VUID-vkCmdEndRenderPass-None-07004).

        VERIFY_EXPR(m_VkCmdBuffer != VK_NULL_HANDLE);
        vkCmdBeginQuery(m_VkCmdBuffer, queryPool, query, flags);
        if (IsInRenderScope())
            m_State.InsidePassQueries |= queryFlag;
        else
            m_State.OutsidePassQueries |= queryFlag;
    }